

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::PrepareZ
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *y,
          TPZFMatrix<std::complex<long_double>_> *z,complex<long_double> beta,int opt)

{
  longdouble __r;
  bool bVar1;
  TPZFMatrix<std::complex<long_double>_> *this_00;
  complex<long_double> *pcVar2;
  int in_ECX;
  TPZFMatrix<std::complex<long_double>_> *in_RDX;
  TPZFMatrix<std::complex<long_double>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  complex<long_double> *in_stack_00000018;
  complex<long_double> *in_stack_00000020;
  int64_t i;
  complex<long_double> *yp;
  complex<long_double> *zlast;
  complex<long_double> *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  int64_t in_stack_ffffffffffffff68;
  long local_78;
  complex<long_double> local_68;
  complex<long_double> *local_48;
  complex<long_double> *local_40;
  long local_38;
  int64_t local_30;
  TPZFMatrix<std::complex<long_double>_> *local_28;
  TPZFMatrix<std::complex<long_double>_> *local_18;
  TPZFMatrix<std::complex<long_double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX == 0) {
    this_00 = (TPZFMatrix<std::complex<long_double>_> *)TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    this_00 = (TPZFMatrix<std::complex<long_double>_> *)TPZBaseMatrix::Cols(in_RDI);
  }
  local_28 = this_00;
  local_30 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
  (*(local_18->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local_18,local_28,local_30);
  for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
    local_40 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (this_00,in_stack_ffffffffffffff68,
                          CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60));
    local_48 = local_40 + (long)local_28;
    __r = (longdouble)0;
    pcVar2 = SUB108(__r,0);
    in_stack_ffffffffffffff60 = (undefined2)((unkuint10)__r >> 0x40);
    std::complex<long_double>::complex(&local_68,__r,__r);
    bVar1 = std::operator!=((complex<long_double> *)
                            CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),pcVar2);
    if (bVar1) {
      pcVar2 = TPZFMatrix<std::complex<long_double>_>::g(local_10,0,local_38);
      if (local_18 != local_10) {
        memcpy(local_40,pcVar2,(long)local_28 << 5);
      }
      for (local_78 = 0; local_78 < (long)local_28; local_78 = local_78 + 1) {
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (this_00,in_stack_ffffffffffffff68,
                   CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60));
        std::complex<long_double>::operator*=(in_stack_00000020,in_stack_00000018);
      }
    }
    else {
      for (; local_40 != local_48; local_40 = local_40 + 1) {
        std::complex<long_double>::operator=(local_40,(longdouble)0);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}